

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O2

Error llvm::DWARFDebugLoclists::visitLocationList
                (DWARFDataExtractor *Data,uint64_t *Offset,uint16_t Version,
                function_ref<bool_(const_llvm::DWARFDebugLoclists::Entry_&)> F)

{
  bool bVar1;
  byte bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  char *Fmt;
  uint64_t uVar5;
  undefined6 in_register_00000012;
  ulong uVar6;
  undefined8 in_R9;
  error_code EC;
  byte local_98 [8];
  Entry E;
  Error local_58;
  undefined1 local_50 [8];
  Cursor C;
  ushort local_34;
  
  local_50 = *(undefined1 (*) [8])CONCAT62(in_register_00000012,Version);
  C.Offset = 1;
  C.Err.Payload = (ErrorInfoBase *)Data;
  do {
    E.Value1 = (uint64_t)
               &E.Loc.super_SmallVectorImpl<unsigned_char>.
                super_SmallVectorTemplateBase<unsigned_char,_true>.
                super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
    E.Loc.super_SmallVectorImpl<unsigned_char>.super_SmallVectorTemplateBase<unsigned_char,_true>.
    super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX =
         (void *)0x400000000;
    E._0_8_ = local_50;
    local_98[0] = DataExtractor::getU8((DataExtractor *)Offset,(Cursor *)local_50);
    local_34 = (ushort)F.callback;
    switch(local_98[0]) {
    case 0:
      goto switchD_00b37e11_caseD_0;
    case 1:
      E.Offset = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_50);
      break;
    default:
      local_58.Payload = (ErrorInfoBase *)(C.Offset | 1);
      C.Offset = 0;
      cantFail(&local_58,(char *)0x0);
      if ((long *)((ulong)local_58.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_58.Payload & 0xfffffffffffffffe) + 8))();
      }
      Fmt = (char *)std::_V2::generic_category();
      E.Loc._20_4_ = ZEXT14(local_98[0]);
      EC._M_cat = (error_category *)0x54;
      EC._0_8_ = C.Err.Payload;
      createStringError<int>(EC,Fmt,(int *)"LLE of kind %x not supported");
      goto LAB_00b37f7b;
    case 3:
      E.Offset = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_50);
      if (local_34 < 5) {
        uVar4 = DataExtractor::getU32((DataExtractor *)Offset,(Cursor *)local_50);
        E.Value0 = (uint64_t)uVar4;
      }
      else {
        E.Value0 = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_50);
      }
      break;
    case 4:
      E.Offset = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_50);
      E.Value0 = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_50);
      break;
    case 6:
      E.Offset = DWARFDataExtractor::getRelocatedAddress
                           ((DWARFDataExtractor *)Offset,(Cursor *)local_50,(uint64_t *)0x0);
      break;
    case 8:
      E.Offset = DWARFDataExtractor::getRelocatedAddress
                           ((DWARFDataExtractor *)Offset,(Cursor *)local_50,(uint64_t *)0x0);
      E.Value0 = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_50);
    }
    if ((6 < local_98[0]) || ((0x43U >> (local_98[0] & 0x1f) & 1) == 0)) {
      if (local_34 < 5) {
        uVar3 = DataExtractor::getU16((DataExtractor *)Offset,(Cursor *)local_50);
        uVar4 = (uint32_t)uVar3;
      }
      else {
        uVar5 = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_50);
        uVar4 = (uint32_t)uVar5;
      }
      DataExtractor::getU8
                ((DataExtractor *)Offset,(Cursor *)local_50,
                 (SmallVectorImpl<unsigned_char> *)&E.Value1,uVar4);
    }
switchD_00b37e11_caseD_0:
    uVar5 = C.Offset;
    uVar6 = C.Offset & 0xfffffffffffffffe;
    C.Offset = uVar6 != 0 | uVar6;
    if (uVar6 == 0) {
      bVar2 = (*(code *)F.callable)(in_R9,local_98);
      bVar2 = bVar2 & local_98[0] != 0;
      bVar1 = true;
    }
    else {
      C.Offset = 0;
      (C.Err.Payload)->_vptr_ErrorInfoBase = (_func_int **)(uVar5 | 1);
LAB_00b37f7b:
      bVar2 = 1;
      bVar1 = false;
    }
    SmallVectorImpl<unsigned_char>::~SmallVectorImpl((SmallVectorImpl<unsigned_char> *)&E.Value1);
    if (!bVar1) goto LAB_00b37fda;
  } while (bVar2 != 0);
  *(undefined1 (*) [8])CONCAT62(in_register_00000012,Version) = local_50;
  (C.Err.Payload)->_vptr_ErrorInfoBase = (_func_int **)0x1;
LAB_00b37fda:
  if ((long *)(C.Offset & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)(C.Offset & 0xfffffffffffffffe) + 8))();
  }
  return (Error)(Error)C.Err.Payload;
}

Assistant:

Error DWARFDebugLoclists::visitLocationList(
    const DWARFDataExtractor &Data, uint64_t *Offset, uint16_t Version,
    llvm::function_ref<bool(const Entry &)> F) {

  DataExtractor::Cursor C(*Offset);
  bool Continue = true;
  while (Continue) {
    Entry E;
    E.Offset = C.tell();
    E.Kind = Data.getU8(C);
    switch (E.Kind) {
    case dwarf::DW_LLE_end_of_list:
      break;
    case dwarf::DW_LLE_base_addressx:
      E.Value0 = Data.getULEB128(C);
      break;
    case dwarf::DW_LLE_startx_length:
      E.Value0 = Data.getULEB128(C);
      // Pre-DWARF 5 has different interpretation of the length field. We have
      // to support both pre- and standartized styles for the compatibility.
      if (Version < 5)
        E.Value1 = Data.getU32(C);
      else
        E.Value1 = Data.getULEB128(C);
      break;
    case dwarf::DW_LLE_offset_pair:
      E.Value0 = Data.getULEB128(C);
      E.Value1 = Data.getULEB128(C);
      break;
    case dwarf::DW_LLE_base_address:
      E.Value0 = Data.getRelocatedAddress(C);
      break;
    case dwarf::DW_LLE_start_length:
      E.Value0 = Data.getRelocatedAddress(C);
      E.Value1 = Data.getULEB128(C);
      break;
    case dwarf::DW_LLE_startx_endx:
    case dwarf::DW_LLE_default_location:
    case dwarf::DW_LLE_start_end:
    default:
      cantFail(C.takeError());
      return createStringError(errc::illegal_byte_sequence,
                               "LLE of kind %x not supported", (int)E.Kind);
    }

    if (E.Kind != dwarf::DW_LLE_base_address &&
        E.Kind != dwarf::DW_LLE_base_addressx &&
        E.Kind != dwarf::DW_LLE_end_of_list) {
      unsigned Bytes = Version >= 5 ? Data.getULEB128(C) : Data.getU16(C);
      // A single location description describing the location of the object...
      Data.getU8(C, E.Loc, Bytes);
    }

    if (!C)
      return C.takeError();
    Continue = F(E) && E.Kind != dwarf::DW_LLE_end_of_list;
  }
  *Offset = C.tell();
  return Error::success();
}